

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

PatternList *
parse_expr(PatternList *__return_storage_ptr__,Tokens *tokens,
          vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  undefined1 auVar1 [8];
  undefined1 auVar2 [8];
  pointer psVar3;
  pointer psVar4;
  int iVar5;
  string *psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  PatternList *extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  string local_d0;
  PatternList *local_b0;
  PatternList local_a8;
  undefined1 auStack_88 [8];
  PatternList ret;
  PatternList local_68;
  undefined1 auStack_48 [8];
  PatternList seq;
  
  local_b0 = __return_storage_ptr__;
  parse_seq((PatternList *)auStack_48,tokens,options);
  psVar6 = Tokens::current_abi_cxx11_(tokens);
  iVar5 = std::__cxx11::string::compare((char *)psVar6);
  if (iVar5 == 0) {
    auStack_88 = (undefined1  [8])0x0;
    ret.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ret.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    maybe_collapse_to_required(&local_a8);
    std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
    emplace_back<std::shared_ptr<docopt::Pattern>>
              ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                *)auStack_88,(shared_ptr<docopt::Pattern> *)&local_a8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a8.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    while( true ) {
      psVar6 = Tokens::current_abi_cxx11_(tokens);
      iVar5 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar5 != 0) break;
      Tokens::pop_abi_cxx11_(&local_d0,tokens);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      parse_seq(&local_68,tokens,options);
      local_a8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           seq.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           seq.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_a8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_48;
      auStack_48 = (undefined1  [8])
                   local_68.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      seq.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_68.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      seq.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_68.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_a8);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_68);
      maybe_collapse_to_required(&local_a8);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Pattern>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)auStack_88,(shared_ptr<docopt::Pattern> *)&local_a8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a8.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    if ((long)ret.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 == 0x10) {
      local_68.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_88)->
                    _M_ptr;
      local_68.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_88)->
                    _M_refcount)._M_pi;
      (((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_88)->_M_refcount)._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_88)->_M_ptr =
           (element_type *)0x0;
    }
    else {
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
      psVar4 = ret.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar3 = ret.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar1 = auStack_88;
      p_Var7->_M_use_count = 1;
      p_Var7->_M_weak_count = 1;
      p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00199c18;
      ret.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_88 = (undefined1  [8])0x0;
      auVar2 = auStack_88;
      ret.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      auStack_88._0_4_ = auVar1._0_4_;
      auStack_88._4_4_ = auVar1._4_4_;
      p_Var7[1]._M_use_count = auStack_88._0_4_;
      p_Var7[1]._M_weak_count = auStack_88._4_4_;
      p_Var7[2]._vptr__Sp_counted_base = (_func_int **)psVar3;
      *(pointer *)&p_Var7[2]._M_use_count = psVar4;
      local_a8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR_flat_00199590;
      auStack_88 = auVar2;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_a8);
      local_68.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(p_Var7 + 1);
      local_68.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var7;
    }
    __l._M_len = 1;
    __l._M_array = (iterator)&local_68;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector(local_b0,__l,(allocator_type *)&local_a8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_68.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)auStack_88);
  }
  else {
    (local_b0->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_48;
    (local_b0->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         seq.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_b0->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         seq.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_48 = (undefined1  [8])0x0;
    seq.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    seq.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)auStack_48);
  return extraout_RAX;
}

Assistant:

PatternList parse_expr(Tokens& tokens, std::vector<Option>& options)
{
	// expr ::= seq ( '|' seq )* ;

	auto seq = parse_seq(tokens, options);

	if (tokens.current() != "|")
		return seq;

	PatternList ret;
	ret.emplace_back(maybe_collapse_to_required(std::move(seq)));

	while (tokens.current() == "|") {
		tokens.pop();
		seq = parse_seq(tokens, options);
		ret.emplace_back(maybe_collapse_to_required(std::move(seq)));
	}

	return { maybe_collapse_to_either(std::move(ret)) };
}